

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O2

SlidingPuzzleStatePtr __thiscall sliding_puzzle::SlidingPuzzle::getGoalState(SlidingPuzzle *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  SlidingPuzzleStatePtr SVar1;
  
  std::__shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RSI + 0x48));
  SVar1.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  SVar1.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SlidingPuzzleStatePtr)
         SVar1.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SlidingPuzzle::SlidingPuzzleStatePtr SlidingPuzzle::getGoalState()
{
  return goal_;
}